

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O2

char * embree::parseSep(char **token)

{
  size_t sVar1;
  runtime_error *this;
  char *pcVar2;
  
  pcVar2 = *token;
  sVar1 = strspn(pcVar2," \t");
  if (sVar1 != 0) {
    pcVar2 = pcVar2 + sVar1;
    *token = pcVar2;
    return pcVar2;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"separator expected");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline const char* parseSep(const char*& token) {
    size_t sep = strspn(token, " \t");
    if (!sep) THROW_RUNTIME_ERROR("separator expected");
    return token+=sep;
  }